

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this)

{
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  pointer in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  if (in_RDI->m_dynamic_data != (pointer)0x0) {
    get_alloc(in_RDI);
    Catch::clara::std::allocator_traits<std::allocator<int>_>::deallocate
              ((allocator_type *)in_RDI,in_stack_ffffffffffffffe8,0x1f0293);
  }
  Catch::clara::std::allocator<int>::~allocator((allocator<int> *)0x1f02a1);
  return;
}

Assistant:

~small_vector()
    {
        clear();

        if (m_dynamic_data)
        {
            atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
        }
    }